

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

optional<function_element_token> *
read_quadratic_element
          (optional<function_element_token> *__return_storage_ptr__,string_view buf_1,
          string_view buf_2,string_view buf_3)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  string_view rhs;
  string_view rhs_00;
  string_view buf;
  string_view lhs;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> name_opt;
  _Storage<real_token,_true> local_60;
  char local_50;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_48;
  char local_38;
  
  read_real((optional<real_token> *)&local_60._M_value,buf_1,buf_2);
  if (local_50 != '\0') {
    pcVar4 = buf_1._M_str;
    sVar5 = buf_1._M_len;
    if ((local_60._M_value.read != 0) &&
       (pcVar4 = buf_2._M_str, sVar5 = buf_2._M_len, local_60._M_value.read != 1)) {
      pcVar4 = buf_3._M_str;
      sVar5 = buf_3._M_len;
    }
    rhs._M_str = pcVar4;
    rhs._M_len = sVar5;
    lhs._M_str = "binary";
    lhs._M_len = 6;
    bVar1 = are_equal(lhs,rhs);
    bVar2 = true;
    if (!bVar1) {
      lVar3 = 0x18;
      do {
        bVar2 = lVar3 != 0xe8;
        if (lVar3 == 0xe8) break;
        rhs_00._M_str = pcVar4;
        rhs_00._M_len = sVar5;
        bVar1 = are_equal(*(string_view *)(&UNK_00731988 + lVar3),rhs_00);
        lVar3 = lVar3 + 0x10;
      } while (!bVar1);
    }
    if ((!(bool)(sVar5 == 0 | bVar2)) && (bVar2 = is_char_name((int)*pcVar4), bVar2)) {
      buf._M_str = pcVar4;
      buf._M_len = sVar5;
      read_name((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                &local_48._M_value,buf);
      if (local_38 == '\x01') {
        (__return_storage_ptr__->super__Optional_base<function_element_token,_true,_true>).
        _M_payload.super__Optional_payload_base<function_element_token>._M_payload._M_value.factor =
             local_60._M_value.value;
        (__return_storage_ptr__->super__Optional_base<function_element_token,_true,_true>).
        _M_payload.super__Optional_payload_base<function_element_token>._M_payload._M_value.name.
        _M_len = local_48._M_value._M_len;
        (__return_storage_ptr__->super__Optional_base<function_element_token,_true,_true>).
        _M_payload.super__Optional_payload_base<function_element_token>._M_payload._M_value.name.
        _M_str = local_48._M_value._M_str;
        (__return_storage_ptr__->super__Optional_base<function_element_token,_true,_true>).
        _M_payload.super__Optional_payload_base<function_element_token>._M_payload._M_value.read =
             local_60._M_value.read + 1;
      }
      (__return_storage_ptr__->super__Optional_base<function_element_token,_true,_true>)._M_payload.
      super__Optional_payload_base<function_element_token>._M_engaged = local_38 == '\x01';
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->super__Optional_base<function_element_token,_true,_true>)._M_payload.
  super__Optional_payload_base<function_element_token>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<function_element_token>
read_quadratic_element(const std::string_view buf_1,
                       const std::string_view buf_2,
                       const std::string_view buf_3) noexcept
{
    auto value_opt = read_real(buf_1, buf_2);
    if (!value_opt)
        return std::nullopt;

    std::string_view to_read;
    switch (value_opt->read) {
    case 0:
        to_read = buf_1;
        break;
    case 1:
        to_read = buf_2;
        break;
    default:
        to_read = buf_3;
        break;
    }

    if (is_keyword(to_read) || !starts_with_name(to_read))
        return std::nullopt;

    auto name_opt = read_name(to_read);
    if (!name_opt.has_value())
        return std::nullopt;

    return function_element_token(
      value_opt->value, *name_opt, value_opt->read + 1);
}